

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O2

void __thiscall
cfdcapi_psbt_CreatePsbt_Test::cfdcapi_psbt_CreatePsbt_Test(cfdcapi_psbt_CreatePsbt_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_006520d8;
  return;
}

Assistant:

TEST(cfdcapi_psbt, CreatePsbt) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* exp_psbt_base64 = "cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==";
  const char* exp_psbt = "70736274ff0100fd3e010200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c0000800000008000000080010000000100000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000";
  char* output_base64 = nullptr;
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, "", "", 2, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    int64_t amount1 = 0x989680;
    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "de31e525f45b534afb2bbe83a5a0a40f6684722246785f81fc83e1b57cda34f8", 1,
        0xffffffff, amount1, "",
        "wpkh([2a704760/44h/0h/0h/1/1]02565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe)",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "8182ee7dfc1ebfd594097adfee2147f78f8e90c0e8b9e51a952476ce3b6aef5a", 2,
        0xffffffff, amount1, "",
        "wpkh([2a704760/44h/0h/0h/1/2]022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b)",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "3fd9692b7a7cdab3784adcc4890028e706b1e59c8e934414fd9e785249d62da9", 3,
        0xffffffff, amount1, "",
        "wpkh([2a704760/44h/0h/0h/1/3]02e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855)",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "d105c429100625998ac4e58464830119b581604ef5485e95451988b87b2cf7fc", 4,
        0xffffffff, amount1, "",
        "wpkh([2a704760/44h/0h/0h/1/4]033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44)",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "b98f570401eb46bded2d3efb41aba9090d014f083a0ad2d232c8229a4d1abea0", 5,
        0xffffffff, amount1, "",
        "wpkh([2a704760/44h/0h/0h/1/5]02fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504)",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "95b6bec453093ab0e4291eca70449476988c9ad6053377432c3e655bbf41a171", 1,
        0xffffffff, 0x2faf080, "",
        "wpkh([9d6b6d86/44h/0h/0h/1/1]03e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec)",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    uint32_t index = 0;
    ret = CfdAddPsbtTxOutWithPubkey(handle, psbt_handle,
        50000000, "",
        "wpkh([2a704760/44h/0h/0h/0/2]03473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81)",
        &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(0, index);

    ret = CfdAddPsbtTxOutWithPubkey(handle, psbt_handle,
        50000000, "",
        "wpkh([9d6b6d86/44h/0h/0h/0/2]036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c)",
        &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);

    ret = CfdGetPsbtData(handle, psbt_handle, &output_base64, &output);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_psbt_base64, output_base64);
      EXPECT_STREQ(exp_psbt, output);
      CfdFreeStringBuffer(output_base64);
      output_base64 = nullptr;
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}